

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Index * sqlite3FindIndex(sqlite3 *db,char *zName,char *zDb)

{
  Schema *pSVar1;
  int iVar2;
  Index *pIVar3;
  uint uVar4;
  uint iDb;
  
  uVar4 = 0;
  while( true ) {
    if (db->nDb <= (int)uVar4) {
      return (Index *)0x0;
    }
    iDb = uVar4 < 2 ^ uVar4;
    pSVar1 = db->aDb[iDb].pSchema;
    if (((zDb == (char *)0x0) || (iVar2 = sqlite3DbIsNamed(db,iDb,zDb), iVar2 != 0)) &&
       (pIVar3 = (Index *)sqlite3HashFind(&pSVar1->idxHash,zName), pIVar3 != (Index *)0x0)) break;
    uVar4 = uVar4 + 1;
  }
  return pIVar3;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3FindIndex(sqlite3 *db, const char *zName, const char *zDb){
  Index *p = 0;
  int i;
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    Schema *pSchema = db->aDb[j].pSchema;
    assert( pSchema );
    if( zDb && sqlite3DbIsNamed(db, j, zDb)==0 ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&pSchema->idxHash, zName);
    if( p ) break;
  }
  return p;
}